

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitSIMDLoad(PrintExpressionContents *this,SIMDLoad *curr)

{
  Index IVar1;
  address64_t aVar2;
  ostream *poVar3;
  Module *in_R8;
  Name name;
  SIMDLoad *curr_local;
  PrintExpressionContents *this_local;
  
  prepareColor(this->o);
  switch(curr->op) {
  case Load8SplatVec128:
    std::operator<<(this->o,"v128.load8_splat");
    break;
  case Load16SplatVec128:
    std::operator<<(this->o,"v128.load16_splat");
    break;
  case Load32SplatVec128:
    std::operator<<(this->o,"v128.load32_splat");
    break;
  case Load64SplatVec128:
    std::operator<<(this->o,"v128.load64_splat");
    break;
  case Load8x8SVec128:
    std::operator<<(this->o,"v128.load8x8_s");
    break;
  case Load8x8UVec128:
    std::operator<<(this->o,"v128.load8x8_u");
    break;
  case Load16x4SVec128:
    std::operator<<(this->o,"v128.load16x4_s");
    break;
  case Load16x4UVec128:
    std::operator<<(this->o,"v128.load16x4_u");
    break;
  case Load32x2SVec128:
    std::operator<<(this->o,"v128.load32x2_s");
    break;
  case Load32x2UVec128:
    std::operator<<(this->o,"v128.load32x2_u");
    break;
  case Load32ZeroVec128:
    std::operator<<(this->o,"v128.load32_zero");
    break;
  case Load64ZeroVec128:
    std::operator<<(this->o,"v128.load64_zero");
  }
  restoreNormalColor(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_217::printMemoryName
            ((anon_unknown_217 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
  if (aVar2 != 0) {
    poVar3 = std::operator<<(this->o," offset=");
    aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
    std::ostream::operator<<(poVar3,aVar2);
  }
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
  IVar1 = SIMDLoad::getMemBytes(curr);
  if (aVar2 != IVar1) {
    poVar3 = std::operator<<(this->o," align=");
    aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
    std::ostream::operator<<(poVar3,aVar2);
  }
  return;
}

Assistant:

void visitSIMDLoad(SIMDLoad* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Load8SplatVec128:
        o << "v128.load8_splat";
        break;
      case Load16SplatVec128:
        o << "v128.load16_splat";
        break;
      case Load32SplatVec128:
        o << "v128.load32_splat";
        break;
      case Load64SplatVec128:
        o << "v128.load64_splat";
        break;
      case Load8x8SVec128:
        o << "v128.load8x8_s";
        break;
      case Load8x8UVec128:
        o << "v128.load8x8_u";
        break;
      case Load16x4SVec128:
        o << "v128.load16x4_s";
        break;
      case Load16x4UVec128:
        o << "v128.load16x4_u";
        break;
      case Load32x2SVec128:
        o << "v128.load32x2_s";
        break;
      case Load32x2UVec128:
        o << "v128.load32x2_u";
        break;
      case Load32ZeroVec128:
        o << "v128.load32_zero";
        break;
      case Load64ZeroVec128:
        o << "v128.load64_zero";
        break;
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->getMemBytes()) {
      o << " align=" << curr->align;
    }
  }